

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::DescriptorProto::InternalSerializeWithCachedSizesToArray
          (DescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint8 *puVar8;
  uint32 extraout_var;
  size_t __n;
  void *__src;
  EpsCopyOutputStream *in_RDX;
  DescriptorProto *in_RSI;
  DescriptorProto *in_RDI;
  string *s;
  int n_7;
  int i_7;
  uint n_6;
  uint i_6;
  uint n_5;
  uint i_5;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  ptrdiff_t size;
  uint8 **in_stack_fffffffffffffcc8;
  DescriptorProto *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  EpsCopyOutputStream *in_stack_fffffffffffffce0;
  uint8 *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  uint8 *in_stack_fffffffffffffcf8;
  EpsCopyOutputStream *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd18;
  int iVar9;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  uint uVar10;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  uint uVar11;
  uint local_2b0;
  uint uVar12;
  EpsCopyOutputStream *pEVar13;
  DescriptorProto *pDVar14;
  DescriptorProto *local_230;
  
  uVar5 = (in_RDI->_has_bits_).has_bits_[0];
  local_230 = in_RSI;
  if ((uVar5 & 1) != 0) {
    _internal_name_abi_cxx11_((DescriptorProto *)0x4f5381);
    in_stack_fffffffffffffcf8 = (uint8 *)std::__cxx11::string::data();
    _internal_name_abi_cxx11_((DescriptorProto *)0x4f5398);
    std::__cxx11::string::length();
    in_stack_fffffffffffffd00 = in_RDX;
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (Operation)in_stack_fffffffffffffcc8,(char *)0x4f53b8);
    in_RDX = in_stack_fffffffffffffd00;
    _internal_name_abi_cxx11_((DescriptorProto *)0x4f53cf);
    local_230 = (DescriptorProto *)
                io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffd00,
                           (uint32)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                           (string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                           in_stack_fffffffffffffce8);
  }
  uVar12 = 0;
  uVar2 = _internal_field_size((DescriptorProto *)0x4f5406);
  for (; uVar12 < uVar2; uVar12 = uVar12 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    _internal_field(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    puVar8 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)local_230);
    uVar3 = FieldDescriptorProto::GetCachedSize((FieldDescriptorProto *)0x4f54fb);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar8);
    local_230 = (DescriptorProto *)
                FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
                          ((FieldDescriptorProto *)
                           CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                           (EpsCopyOutputStream *)
                           CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  }
  local_2b0 = 0;
  uVar2 = _internal_nested_type_size((DescriptorProto *)0x4f5562);
  for (; local_2b0 < uVar2; local_2b0 = local_2b0 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    _internal_nested_type(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20))
    ;
    pDVar14 = local_230;
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    puVar8 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)local_230);
    uVar3 = GetCachedSize((DescriptorProto *)0x4f5657);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar8);
    local_230 = (DescriptorProto *)
                InternalSerializeWithCachedSizesToArray
                          (pDVar14,(uint8 *)in_RDX,(EpsCopyOutputStream *)CONCAT44(uVar5,uVar12));
  }
  uVar11 = 0;
  uVar12 = _internal_enum_type_size((DescriptorProto *)0x4f56be);
  for (; uVar11 < uVar12; uVar11 = uVar11 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    _internal_enum_type(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    uVar3 = internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    puVar8 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)local_230);
    uVar3 = EnumDescriptorProto::GetCachedSize((EnumDescriptorProto *)0x4f57ad);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar8);
    local_230 = (DescriptorProto *)
                EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
                          ((EnumDescriptorProto *)CONCAT44(uVar2,uVar11),
                           (uint8 *)CONCAT44(uVar12,in_stack_fffffffffffffd40),
                           (EpsCopyOutputStream *)
                           CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  }
  uVar11 = 0;
  uVar2 = _internal_extension_range_size((DescriptorProto *)0x4f5811);
  for (; uVar11 < uVar2; uVar11 = uVar11 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    _internal_extension_range
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    uVar3 = internal::WireFormatLite::MakeTag(5,WIRETYPE_LENGTH_DELIMITED);
    puVar8 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)local_230);
    uVar3 = DescriptorProto_ExtensionRange::GetCachedSize
                      ((DescriptorProto_ExtensionRange *)0x4f58fa);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar8);
    local_230 = (DescriptorProto *)
                DescriptorProto_ExtensionRange::InternalSerializeWithCachedSizesToArray
                          ((DescriptorProto_ExtensionRange *)
                           CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                           in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  }
  uVar10 = 0;
  uVar4 = _internal_extension_size((DescriptorProto *)0x4f5958);
  for (; uVar10 < uVar4; uVar10 = uVar10 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    _internal_extension(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    uVar3 = internal::WireFormatLite::MakeTag(6,WIRETYPE_LENGTH_DELIMITED);
    puVar8 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)local_230);
    uVar3 = FieldDescriptorProto::GetCachedSize((FieldDescriptorProto *)0x4f5a41);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar8);
    local_230 = (DescriptorProto *)
                FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
                          ((FieldDescriptorProto *)CONCAT44(uVar12,uVar11),
                           (uint8 *)CONCAT44(uVar2,uVar10),
                           (EpsCopyOutputStream *)CONCAT44(uVar4,in_stack_fffffffffffffd30));
  }
  if ((uVar5 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    _Internal::options(in_RDI);
    uVar3 = internal::WireFormatLite::MakeTag(7,WIRETYPE_LENGTH_DELIMITED);
    puVar8 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)local_230);
    uVar3 = MessageOptions::GetCachedSize((MessageOptions *)0x4f5b73);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar8);
    local_230 = (DescriptorProto *)
                MessageOptions::InternalSerializeWithCachedSizesToArray
                          ((MessageOptions *)
                           CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                           in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  }
  uVar2 = 0;
  uVar5 = _internal_oneof_decl_size((DescriptorProto *)0x4f5bc1);
  for (; uVar2 < uVar5; uVar2 = uVar2 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    _internal_oneof_decl(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    uVar3 = internal::WireFormatLite::MakeTag(8,WIRETYPE_LENGTH_DELIMITED);
    puVar8 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)local_230);
    uVar3 = OneofDescriptorProto::GetCachedSize((OneofDescriptorProto *)0x4f5caa);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar8);
    local_230 = (DescriptorProto *)
                OneofDescriptorProto::InternalSerializeWithCachedSizesToArray
                          ((OneofDescriptorProto *)in_stack_fffffffffffffd00,
                           in_stack_fffffffffffffcf8,
                           (EpsCopyOutputStream *)
                           CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  }
  uVar12 = 0;
  uVar2 = _internal_reserved_range_size((DescriptorProto *)0x4f5d08);
  for (; uVar12 < uVar2; uVar12 = uVar12 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    _internal_reserved_range
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    uVar3 = internal::WireFormatLite::MakeTag(9,WIRETYPE_LENGTH_DELIMITED);
    puVar8 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)local_230);
    uVar3 = DescriptorProto_ReservedRange::GetCachedSize((DescriptorProto_ReservedRange *)0x4f5df1);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar8);
    local_230 = (DescriptorProto *)
                DescriptorProto_ReservedRange::InternalSerializeWithCachedSizesToArray
                          ((DescriptorProto_ReservedRange *)
                           CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                           in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  }
  iVar9 = 0;
  iVar6 = _internal_reserved_name_size((DescriptorProto *)0x4f5e4f);
  for (; iVar9 < iVar6; iVar9 = iVar9 + 1) {
    _internal_reserved_name_abi_cxx11_
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    std::__cxx11::string::data();
    uVar3 = extraout_var;
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (Operation)in_stack_fffffffffffffcc8,(char *)0x4f5ea5);
    pEVar13 = in_RDX;
    __n = std::__cxx11::string::size();
    bVar1 = true;
    if ((long)__n < 0x80) {
      in_stack_fffffffffffffcd8 = (string *)(in_RDX->end_ + (0x10 - (long)local_230));
      iVar7 = io::EpsCopyOutputStream::TagSize(0x50);
      bVar1 = (long)in_stack_fffffffffffffcd8 + (-1 - (long)iVar7) < (long)__n;
    }
    if (bVar1) {
      local_230 = (DescriptorProto *)
                  io::EpsCopyOutputStream::WriteStringOutline
                            (in_RDX,uVar3,in_stack_fffffffffffffcd8,
                             (uint8 *)in_stack_fffffffffffffcd0);
    }
    else {
      *(uint8 *)&(local_230->super_Message).super_MessageLite._vptr_MessageLite = 'R';
      pDVar14 = (DescriptorProto *)
                ((long)&(local_230->super_Message).super_MessageLite._vptr_MessageLite + 2);
      *(uint8 *)((long)&(local_230->super_Message).super_MessageLite._vptr_MessageLite + 1) =
           (uint8)__n;
      in_stack_fffffffffffffcd0 = pDVar14;
      __src = (void *)std::__cxx11::string::data();
      memcpy(in_stack_fffffffffffffcd0,__src,__n);
      local_230 = (DescriptorProto *)
                  ((long)&(((DescriptorProto *)(&pDVar14->_has_bits_ + -4))->super_Message).
                          super_MessageLite._vptr_MessageLite + __n);
    }
    in_RDX = pEVar13;
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_230 = (DescriptorProto *)
                internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)CONCAT44(uVar5,uVar12),(uint8 *)CONCAT44(uVar2,iVar9),
                           (EpsCopyOutputStream *)CONCAT44(iVar6,in_stack_fffffffffffffd18));
  }
  return (uint8 *)local_230;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* DescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_field_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_field(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nested_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(3, this->_internal_nested_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(5, this->_internal_extension_range(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(6, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        7, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_oneof_decl_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(8, this->_internal_oneof_decl(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(9, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    target = stream->WriteString(10, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}